

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_unique_id(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT *id)

{
  bool bVar1;
  REF_INT local_40;
  REF_INT local_3c;
  int local_38;
  REF_INT local_30;
  REF_BOOL found_one;
  REF_INT geom;
  REF_INT item;
  REF_INT *id_local;
  REF_INT type_local;
  REF_INT node_local;
  REF_GEOM ref_geom_local;
  
  bVar1 = false;
  if ((node < 0) || (ref_geom->ref_adj->nnode <= node)) {
    local_38 = -1;
  }
  else {
    local_38 = ref_geom->ref_adj->first[node];
  }
  found_one = local_38;
  if (local_38 == -1) {
    local_3c = -1;
  }
  else {
    local_3c = ref_geom->ref_adj->item[local_38].ref;
  }
  local_30 = local_3c;
  do {
    if (found_one == -1) {
      if (bVar1) {
        ref_geom_local._4_4_ = 0;
      }
      else {
        ref_geom_local._4_4_ = 5;
      }
      return ref_geom_local._4_4_;
    }
    if (type == ref_geom->descr[local_30 * 6]) {
      if (bVar1) {
        return 3;
      }
      bVar1 = true;
      *id = ref_geom->descr[local_30 * 6 + 1];
    }
    found_one = ref_geom->ref_adj->item[found_one].next;
    if (found_one == -1) {
      local_40 = -1;
    }
    else {
      local_40 = ref_geom->ref_adj->item[found_one].ref;
    }
    local_30 = local_40;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_unique_id(REF_GEOM ref_geom, REF_INT node,
                                      REF_INT type, REF_INT *id) {
  REF_INT item, geom;
  REF_BOOL found_one;
  found_one = REF_FALSE;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom)) {
      if (found_one) return REF_INVALID; /* second one makes invalid */
      found_one = REF_TRUE;
      *id = ref_geom_id(ref_geom, geom);
    }
  }
  if (found_one) return REF_SUCCESS;
  return REF_NOT_FOUND;
}